

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

AnsiPortListSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::AnsiPortListSyntax,slang::syntax::AnsiPortListSyntax_const&>
          (BumpAllocator *this,AnsiPortListSyntax *args)

{
  SyntaxNode *pSVar1;
  Info *pIVar2;
  size_t sVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  AnsiPortListSyntax *pAVar8;
  
  pAVar8 = (AnsiPortListSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((AnsiPortListSyntax *)this->endPtr < pAVar8 + 1) {
    pAVar8 = (AnsiPortListSyntax *)allocateSlow(this,0x70,8);
  }
  else {
    this->head->current = (byte *)(pAVar8 + 1);
  }
  (pAVar8->super_PortListSyntax).super_SyntaxNode.previewNode =
       (args->super_PortListSyntax).super_SyntaxNode.previewNode;
  uVar4 = *(undefined4 *)&(args->super_PortListSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_PortListSyntax).super_SyntaxNode.parent;
  (pAVar8->super_PortListSyntax).super_SyntaxNode.kind =
       (args->super_PortListSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pAVar8->super_PortListSyntax).super_SyntaxNode.field_0x4 = uVar4;
  (pAVar8->super_PortListSyntax).super_SyntaxNode.parent = pSVar1;
  uVar5 = (args->openParen).field_0x2;
  NVar6.raw = (args->openParen).numFlags.raw;
  uVar7 = (args->openParen).rawLen;
  pIVar2 = (args->openParen).info;
  (pAVar8->openParen).kind = (args->openParen).kind;
  (pAVar8->openParen).field_0x2 = uVar5;
  (pAVar8->openParen).numFlags = (NumericTokenFlags)NVar6.raw;
  (pAVar8->openParen).rawLen = uVar7;
  (pAVar8->openParen).info = pIVar2;
  uVar4 = *(undefined4 *)&(args->ports).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->ports).super_SyntaxListBase.super_SyntaxNode.parent;
  (pAVar8->ports).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->ports).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pAVar8->ports).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pAVar8->ports).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pAVar8->ports).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->ports).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pAVar8->ports).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005e5cf8;
  (pAVar8->ports).super_SyntaxListBase.childCount = (args->ports).super_SyntaxListBase.childCount;
  (pAVar8->ports).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005e5dc0;
  sVar3 = (args->ports).elements._M_extent._M_extent_value;
  (pAVar8->ports).elements._M_ptr = (args->ports).elements._M_ptr;
  (pAVar8->ports).elements._M_extent._M_extent_value = sVar3;
  uVar5 = (args->closeParen).field_0x2;
  NVar6.raw = (args->closeParen).numFlags.raw;
  uVar7 = (args->closeParen).rawLen;
  pIVar2 = (args->closeParen).info;
  (pAVar8->closeParen).kind = (args->closeParen).kind;
  (pAVar8->closeParen).field_0x2 = uVar5;
  (pAVar8->closeParen).numFlags = (NumericTokenFlags)NVar6.raw;
  (pAVar8->closeParen).rawLen = uVar7;
  (pAVar8->closeParen).info = pIVar2;
  return pAVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }